

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNdr.c
# Opt level: O0

void Wln_ReadNdrTest(void)

{
  Wln_Ntk_t *p;
  Wln_Ntk_t *pNtk;
  
  p = Wln_ReadNdr("D:\\temp\\brijesh\\for_alan_dff_warning\\work_fir_filter_fir_filter_proc_out.ndr"
                 );
  Wln_WriteVer(p,"test__test.v");
  Wln_NtkPrint(p);
  Wln_NtkStaticFanoutTest(p);
  Wln_NtkFree(p);
  return;
}

Assistant:

void Wln_ReadNdrTest()
{
    Wln_Ntk_t * pNtk = Wln_ReadNdr( "D:\\temp\\brijesh\\for_alan_dff_warning\\work_fir_filter_fir_filter_proc_out.ndr" );
    //Wln_Ntk_t * pNtk = Wln_ReadNdr( "flop.ndr" );
    Wln_WriteVer( pNtk, "test__test.v" );
    Wln_NtkPrint( pNtk );
    Wln_NtkStaticFanoutTest( pNtk );
    Wln_NtkFree( pNtk );
}